

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

void __thiscall Promise::~Promise(Promise *this)

{
  this->_vptr_Promise = (_func_int **)&PTR_Tick_00108c58;
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::~vector
            (&this->children);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&(this->auto_resolved_handler).super__Function_base);
  std::_Function_base::~_Function_base(&(this->manually_resolved_handler).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Promise>)._M_weak_this.
              super___weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~Promise() {
    DEBUG("Promise [%i] destroyed\n", id);
  }